

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall
mkvparser::CuePoint::TrackPosition::Parse
          (TrackPosition *this,IMkvReader *pReader,longlong start_,longlong size_)

{
  longlong lVar1;
  longlong size;
  TrackPosition *pTVar2;
  long lVar3;
  long lVar4;
  long len;
  long local_48;
  TrackPosition *local_40;
  TrackPosition *local_38;
  
  lVar4 = size_ + start_;
  local_40 = (TrackPosition *)&this->m_pos;
  local_38 = (TrackPosition *)&this->m_block;
  *(undefined4 *)&this->m_track = 0xffffffff;
  *(undefined4 *)((long)&this->m_track + 4) = 0xffffffff;
  *(undefined4 *)&this->m_pos = 0xffffffff;
  *(undefined4 *)((long)&this->m_pos + 4) = 0xffffffff;
  this->m_block = 1;
  while( true ) {
    if (lVar4 <= start_) {
      return 0 < this->m_track && -1 < this->m_pos;
    }
    lVar1 = ReadID(pReader,start_,&local_48);
    if ((((lVar1 < 0) || (lVar3 = start_ + local_48, lVar4 < lVar3)) ||
        (size = ReadUInt(pReader,lVar3,&local_48), size < 0)) ||
       ((lVar3 = lVar3 + local_48, lVar4 < lVar3 || (start_ = lVar3 + size, lVar4 < start_))))
    break;
    pTVar2 = local_38;
    if (((lVar1 == 0x5378) || (pTVar2 = this, lVar1 == 0xf7)) || (pTVar2 = local_40, lVar1 == 0xf1))
    {
      lVar1 = UnserializeUInt(pReader,lVar3,size);
      pTVar2->m_track = lVar1;
    }
  }
  return false;
}

Assistant:

bool CuePoint::TrackPosition::Parse(IMkvReader* pReader, long long start_,
                                    long long size_) {
  const long long stop = start_ + size_;
  long long pos = start_;

  m_track = -1;
  m_pos = -1;
  m_block = 1;  // default

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || ((pos + len) > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || ((pos + len) > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTrack)
      m_track = UnserializeUInt(pReader, pos, size);
    else if (id == libwebm::kMkvCueClusterPosition)
      m_pos = UnserializeUInt(pReader, pos, size);
    else if (id == libwebm::kMkvCueBlockNumber)
      m_block = UnserializeUInt(pReader, pos, size);

    pos += size;  // consume payload
  }

  if ((m_pos < 0) || (m_track <= 0)) {
    return false;
  }

  return true;
}